

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::
     genericCheckListDefaults<capnproto_test::capnp::test::TestListDefaults::Reader>(Reader reader)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Reader reader_03;
  Reader reader_04;
  Reader reader_05;
  initializer_list<capnp::Text::Reader> expected;
  initializer_list<capnp::Text::Reader> expected_00;
  initializer_list<capnp::Text::Reader> expected_01;
  initializer_list<int> expected_02;
  initializer_list<int> expected_03;
  initializer_list<int> expected_04;
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  int32_t iVar6;
  uint64_t uVar7;
  Reader local_1380;
  int32_t local_134c;
  int local_1348;
  bool local_1341;
  undefined1 local_1340 [7];
  bool _kj_shouldLog_18;
  uint local_1310;
  uint local_130c;
  Fault local_1308;
  Fault f_11;
  Reader local_12d0;
  int32_t local_129c;
  int local_1298;
  bool local_1291;
  undefined1 local_1290 [7];
  bool _kj_shouldLog_17;
  Reader local_1260;
  int32_t local_122c;
  int local_1228;
  bool local_1221;
  undefined1 local_1220 [7];
  bool _kj_shouldLog_16;
  uint local_11f0;
  uint local_11ec;
  Fault local_11e8;
  Fault f_10;
  Reader e;
  Fault local_11a8;
  Fault f_9;
  Reader l_2;
  Reader RStack_1160;
  int *local_1150;
  undefined8 local_1148;
  Reader local_1140;
  Reader local_1110;
  iterator local_1100;
  undefined8 local_10f8;
  Reader local_10f0;
  Reader local_10c0;
  Reader RStack_10b0;
  iterator local_10a0;
  undefined8 local_1098;
  Reader local_1090;
  uint local_1060;
  uint local_105c;
  Fault local_1058;
  Fault f_8;
  Reader l_1;
  Reader local_1008;
  int local_fd8 [2];
  iterator local_fd0;
  undefined8 local_fc8;
  Reader local_fc0;
  int local_f8c [3];
  iterator local_f80;
  undefined8 local_f78;
  Reader local_f70;
  uint local_f40;
  uint local_f3c;
  Fault local_f38;
  Fault f_7;
  Reader l;
  Reader local_ed0;
  ArrayPtr<const_char> local_ea0;
  bool local_e89;
  undefined1 local_e88 [7];
  bool _kj_shouldLog_15;
  Reader local_e58;
  ArrayPtr<const_char> local_e28;
  Reader local_e18;
  Reader local_de8;
  ArrayPtr<const_char> local_db8;
  bool local_da1;
  undefined1 local_da0 [7];
  bool _kj_shouldLog_14;
  Reader local_d70;
  ArrayPtr<const_char> local_d40;
  Reader local_d30;
  Reader local_d00;
  uint64_t local_cd0;
  unsigned_long local_cc8;
  bool local_cb9;
  undefined1 local_cb8 [7];
  bool _kj_shouldLog_13;
  Reader local_c88;
  Reader local_c58;
  Reader local_c28;
  uint64_t local_bf8;
  unsigned_long local_bf0;
  bool local_be1;
  undefined1 local_be0 [7];
  bool _kj_shouldLog_12;
  Reader local_bb0;
  Reader local_b80;
  Reader local_b50;
  uint32_t local_b1c;
  uint local_b18;
  bool local_b11;
  undefined1 local_b10 [7];
  bool _kj_shouldLog_11;
  Reader local_ae0;
  Reader local_ab0;
  Reader local_a80;
  uint32_t local_a4c;
  uint local_a48;
  bool local_a41;
  undefined1 local_a40 [7];
  bool _kj_shouldLog_10;
  Reader local_a10;
  Reader local_9e0;
  Reader local_9b0;
  uint16_t local_97a;
  uint local_978;
  bool local_971;
  undefined1 local_970 [7];
  bool _kj_shouldLog_9;
  Reader local_940;
  Reader local_910;
  Reader local_8e0;
  uint16_t local_8aa;
  uint local_8a8;
  bool local_8a1;
  undefined1 local_8a0 [7];
  bool _kj_shouldLog_8;
  Reader local_870;
  Reader local_840;
  Reader local_810;
  uint8_t local_7d9;
  uint local_7d8;
  bool local_7d1;
  undefined1 local_7d0 [7];
  bool _kj_shouldLog_7;
  Reader local_7a0;
  Reader local_770;
  Reader local_740;
  uint8_t local_709;
  uint local_708;
  bool local_701;
  undefined1 local_700 [7];
  bool _kj_shouldLog_6;
  Reader local_6d0;
  bool local_699;
  undefined1 local_698 [7];
  bool _kj_shouldLog_5;
  Reader local_668;
  bool local_631;
  undefined1 local_630 [7];
  bool _kj_shouldLog_4;
  Reader local_600;
  bool local_5c9;
  undefined1 local_5c8 [7];
  bool _kj_shouldLog_3;
  Reader local_598;
  bool local_561;
  undefined1 local_560 [7];
  bool _kj_shouldLog_2;
  Reader local_530;
  Reader local_4f8;
  Reader local_4c8;
  Void local_493;
  bool local_492;
  undefined1 local_490 [6];
  bool _kj_shouldLog_1;
  Reader local_460;
  Reader local_428;
  Reader local_3f8;
  Void local_3c3;
  bool local_3c2;
  undefined1 local_3c0 [6];
  bool _kj_shouldLog;
  Reader local_390;
  Reader local_358;
  uint local_328;
  uint local_324;
  Fault local_320;
  Fault f_6;
  Reader local_2e8;
  uint local_2b8;
  uint local_2b4;
  Fault local_2b0;
  Fault f_5;
  Reader local_278;
  uint local_248;
  uint local_244;
  Fault local_240;
  Fault f_4;
  Reader local_208;
  uint local_1d8;
  uint local_1d4;
  Fault local_1d0;
  Fault f_3;
  Reader local_198;
  uint local_168;
  uint local_164;
  Fault local_160;
  Fault f_2;
  Reader local_128;
  uint local_f8;
  uint local_f4;
  Fault local_f0;
  Fault f_1;
  Reader local_a8;
  uint local_78;
  uint local_74;
  Fault local_70;
  Fault f;
  undefined1 local_38 [8];
  Reader lists;
  
  capnproto_test::capnp::test::TestListDefaults::Reader::getLists
            ((Reader *)local_38,(Reader *)&stack0x00000008);
  capnproto_test::capnp::test::TestLists::Reader::getList0((Reader *)&f,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f);
  if (uVar4 != 2) {
    local_74 = 2;
    capnproto_test::capnp::test::TestLists::Reader::getList0(&local_a8,(Reader *)local_38);
    local_78 = List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Reader::size
                         (&local_a8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2c7,FAILED,"(2u) == (lists.getList0().size())","2u, lists.getList0().size()",
               &local_74,&local_78);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  capnproto_test::capnp::test::TestLists::Reader::getList1((Reader *)&f_1,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_1);
  if (uVar4 != 4) {
    local_f4 = 4;
    capnproto_test::capnp::test::TestLists::Reader::getList1(&local_128,(Reader *)local_38);
    local_f8 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::size
                         (&local_128);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2c8,FAILED,"(4u) == (lists.getList1().size())","4u, lists.getList1().size()",
               &local_f4,&local_f8);
    kj::_::Debug::Fault::fatal(&local_f0);
  }
  capnproto_test::capnp::test::TestLists::Reader::getList8((Reader *)&f_2,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_2);
  if (uVar4 != 2) {
    local_164 = 2;
    capnproto_test::capnp::test::TestLists::Reader::getList8(&local_198,(Reader *)local_38);
    local_168 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::size
                          (&local_198);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2c9,FAILED,"(2u) == (lists.getList8().size())","2u, lists.getList8().size()",
               &local_164,&local_168);
    kj::_::Debug::Fault::fatal(&local_160);
  }
  capnproto_test::capnp::test::TestLists::Reader::getList16((Reader *)&f_3,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_3);
  if (uVar4 != 2) {
    local_1d4 = 2;
    capnproto_test::capnp::test::TestLists::Reader::getList16(&local_208,(Reader *)local_38);
    local_1d8 = List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Reader::size
                          (&local_208);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2ca,FAILED,"(2u) == (lists.getList16().size())","2u, lists.getList16().size()",
               &local_1d4,&local_1d8);
    kj::_::Debug::Fault::fatal(&local_1d0);
  }
  capnproto_test::capnp::test::TestLists::Reader::getList32((Reader *)&f_4,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_4);
  if (uVar4 != 2) {
    local_244 = 2;
    capnproto_test::capnp::test::TestLists::Reader::getList32(&local_278,(Reader *)local_38);
    local_248 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::size
                          (&local_278);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2cb,FAILED,"(2u) == (lists.getList32().size())","2u, lists.getList32().size()",
               &local_244,&local_248);
    kj::_::Debug::Fault::fatal(&local_240);
  }
  capnproto_test::capnp::test::TestLists::Reader::getList64((Reader *)&f_5,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_5);
  if (uVar4 != 2) {
    local_2b4 = 2;
    capnproto_test::capnp::test::TestLists::Reader::getList64(&local_2e8,(Reader *)local_38);
    local_2b8 = List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Reader::size
                          (&local_2e8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2cc,FAILED,"(2u) == (lists.getList64().size())","2u, lists.getList64().size()",
               &local_2b4,&local_2b8);
    kj::_::Debug::Fault::fatal(&local_2b0);
  }
  capnproto_test::capnp::test::TestLists::Reader::getListP((Reader *)&f_6,(Reader *)local_38);
  uVar4 = List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_6);
  if (uVar4 != 2) {
    local_324 = 2;
    capnproto_test::capnp::test::TestLists::Reader::getListP(&local_358,(Reader *)local_38);
    local_328 = List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Reader::size
                          (&local_358);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2cd,FAILED,"(2u) == (lists.getListP().size())","2u, lists.getListP().size()",
               &local_324,&local_328);
    kj::_::Debug::Fault::fatal(&local_320);
  }
  capnproto_test::capnp::test::TestLists::Reader::getList0((Reader *)local_3c0,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Reader::operator[]
            (&local_390,(Reader *)local_3c0,0);
  capnproto_test::capnp::test::TestLists::Struct0::Reader::getF(&local_390);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_3c2 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c2 != false) {
      capnproto_test::capnp::test::TestLists::Reader::getList0(&local_428,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Reader::operator[]
                (&local_3f8,&local_428,0);
      capnproto_test::capnp::test::TestLists::Struct0::Reader::getF(&local_3f8);
      kj::_::Debug::log<char_const(&)[56],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2cf,ERROR,
                 "\"failed: expected \" \"(VOID) == (lists.getList0()[0].getF())\", VOID, lists.getList0()[0].getF()"
                 ,(char (*) [56])"failed: expected (VOID) == (lists.getList0()[0].getF())",
                 (Void *)&VOID,&local_3c3);
      local_3c2 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList0((Reader *)local_490,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Reader::operator[]
            (&local_460,(Reader *)local_490,1);
  capnproto_test::capnp::test::TestLists::Struct0::Reader::getF(&local_460);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_492 = kj::_::Debug::shouldLog(ERROR);
    while (local_492 != false) {
      capnproto_test::capnp::test::TestLists::Reader::getList0(&local_4f8,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Reader::operator[]
                (&local_4c8,&local_4f8,1);
      capnproto_test::capnp::test::TestLists::Struct0::Reader::getF(&local_4c8);
      kj::_::Debug::log<char_const(&)[56],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d0,ERROR,
                 "\"failed: expected \" \"(VOID) == (lists.getList0()[1].getF())\", VOID, lists.getList0()[1].getF()"
                 ,(char (*) [56])"failed: expected (VOID) == (lists.getList0()[1].getF())",
                 (Void *)&VOID,&local_493);
      local_492 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList1((Reader *)local_560,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            (&local_530,(Reader *)local_560,0);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF(&local_530);
  if (!bVar1) {
    local_561 = kj::_::Debug::shouldLog(ERROR);
    while (local_561 != false) {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d1,ERROR,"\"failed: expected \" \"lists.getList1()[0].getF()\"",
                 (char (*) [44])"failed: expected lists.getList1()[0].getF()");
      local_561 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList1((Reader *)local_5c8,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            (&local_598,(Reader *)local_5c8,1);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF(&local_598);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_5c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5c9 != false) {
      kj::_::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d2,ERROR,"\"failed: expected \" \"!(lists.getList1()[1].getF())\"",
                 (char (*) [47])"failed: expected !(lists.getList1()[1].getF())");
      local_5c9 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList1((Reader *)local_630,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            (&local_600,(Reader *)local_630,2);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF(&local_600);
  if (!bVar1) {
    local_631 = kj::_::Debug::shouldLog(ERROR);
    while (local_631 != false) {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d3,ERROR,"\"failed: expected \" \"lists.getList1()[2].getF()\"",
                 (char (*) [44])"failed: expected lists.getList1()[2].getF()");
      local_631 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList1((Reader *)local_698,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            (&local_668,(Reader *)local_698,3);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF(&local_668);
  if (!bVar1) {
    local_699 = kj::_::Debug::shouldLog(ERROR);
    while (local_699 != false) {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d4,ERROR,"\"failed: expected \" \"lists.getList1()[3].getF()\"",
                 (char (*) [44])"failed: expected lists.getList1()[3].getF()");
      local_699 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList8((Reader *)local_700,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
            (&local_6d0,(Reader *)local_700,0);
  uVar2 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_6d0);
  if (uVar2 != '{') {
    local_701 = kj::_::Debug::shouldLog(ERROR);
    while (local_701 != false) {
      local_708 = 0x7b;
      capnproto_test::capnp::test::TestLists::Reader::getList8(&local_770,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
                (&local_740,&local_770,0);
      local_709 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_740);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d5,ERROR,
                 "\"failed: expected \" \"(123u) == (lists.getList8()[0].getF())\", 123u, lists.getList8()[0].getF()"
                 ,(char (*) [56])"failed: expected (123u) == (lists.getList8()[0].getF())",
                 &local_708,&local_709);
      local_701 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList8((Reader *)local_7d0,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
            (&local_7a0,(Reader *)local_7d0,1);
  uVar2 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_7a0);
  if (uVar2 != '-') {
    local_7d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7d1 != false) {
      local_7d8 = 0x2d;
      capnproto_test::capnp::test::TestLists::Reader::getList8(&local_840,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
                (&local_810,&local_840,1);
      local_7d9 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_810);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d6,ERROR,
                 "\"failed: expected \" \"(45u) == (lists.getList8()[1].getF())\", 45u, lists.getList8()[1].getF()"
                 ,(char (*) [55])"failed: expected (45u) == (lists.getList8()[1].getF())",&local_7d8
                 ,&local_7d9);
      local_7d1 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList16((Reader *)local_8a0,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Reader::operator[]
            (&local_870,(Reader *)local_8a0,0);
  uVar3 = capnproto_test::capnp::test::TestLists::Struct16::Reader::getF(&local_870);
  if (uVar3 != 0x3039) {
    local_8a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8a1 != false) {
      local_8a8 = 0x3039;
      capnproto_test::capnp::test::TestLists::Reader::getList16(&local_910,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Reader::operator[]
                (&local_8e0,&local_910,0);
      local_8aa = capnproto_test::capnp::test::TestLists::Struct16::Reader::getF(&local_8e0);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d7,ERROR,
                 "\"failed: expected \" \"(12345u) == (lists.getList16()[0].getF())\", 12345u, lists.getList16()[0].getF()"
                 ,(char (*) [59])"failed: expected (12345u) == (lists.getList16()[0].getF())",
                 &local_8a8,&local_8aa);
      local_8a1 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList16((Reader *)local_970,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Reader::operator[]
            (&local_940,(Reader *)local_970,1);
  uVar3 = capnproto_test::capnp::test::TestLists::Struct16::Reader::getF(&local_940);
  if (uVar3 != 0x1a85) {
    local_971 = kj::_::Debug::shouldLog(ERROR);
    while (local_971 != false) {
      local_978 = 0x1a85;
      capnproto_test::capnp::test::TestLists::Reader::getList16(&local_9e0,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Reader::operator[]
                (&local_9b0,&local_9e0,1);
      local_97a = capnproto_test::capnp::test::TestLists::Struct16::Reader::getF(&local_9b0);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d8,ERROR,
                 "\"failed: expected \" \"(6789u) == (lists.getList16()[1].getF())\", 6789u, lists.getList16()[1].getF()"
                 ,(char (*) [58])"failed: expected (6789u) == (lists.getList16()[1].getF())",
                 &local_978,&local_97a);
      local_971 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList32((Reader *)local_a40,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
            (&local_a10,(Reader *)local_a40,0);
  uVar5 = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_a10);
  if (uVar5 != 0x75bcd15) {
    local_a41 = kj::_::Debug::shouldLog(ERROR);
    while (local_a41 != false) {
      local_a48 = 0x75bcd15;
      capnproto_test::capnp::test::TestLists::Reader::getList32(&local_ab0,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
                (&local_a80,&local_ab0,0);
      local_a4c = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_a80);
      kj::_::Debug::log<char_const(&)[63],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2d9,ERROR,
                 "\"failed: expected \" \"(123456789u) == (lists.getList32()[0].getF())\", 123456789u, lists.getList32()[0].getF()"
                 ,(char (*) [63])"failed: expected (123456789u) == (lists.getList32()[0].getF())",
                 &local_a48,&local_a4c);
      local_a41 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList32((Reader *)local_b10,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
            (&local_ae0,(Reader *)local_b10,1);
  uVar5 = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_ae0);
  if (uVar5 != 0xdfb38d2) {
    local_b11 = kj::_::Debug::shouldLog(ERROR);
    while (local_b11 != false) {
      local_b18 = 0xdfb38d2;
      capnproto_test::capnp::test::TestLists::Reader::getList32(&local_b80,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
                (&local_b50,&local_b80,1);
      local_b1c = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_b50);
      kj::_::Debug::log<char_const(&)[63],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2da,ERROR,
                 "\"failed: expected \" \"(234567890u) == (lists.getList32()[1].getF())\", 234567890u, lists.getList32()[1].getF()"
                 ,(char (*) [63])"failed: expected (234567890u) == (lists.getList32()[1].getF())",
                 &local_b18,&local_b1c);
      local_b11 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList64((Reader *)local_be0,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Reader::operator[]
            (&local_bb0,(Reader *)local_be0,0);
  uVar7 = capnproto_test::capnp::test::TestLists::Struct64::Reader::getF(&local_bb0);
  if (uVar7 != 0x462d53c8abac0) {
    local_be1 = kj::_::Debug::shouldLog(ERROR);
    while (local_be1 != false) {
      local_bf0 = 0x462d53c8abac0;
      capnproto_test::capnp::test::TestLists::Reader::getList64(&local_c58,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Reader::operator[]
                (&local_c28,&local_c58,0);
      local_bf8 = capnproto_test::capnp::test::TestLists::Struct64::Reader::getF(&local_c28);
      kj::_::Debug::log<char_const(&)[70],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2db,ERROR,
                 "\"failed: expected \" \"(1234567890123456u) == (lists.getList64()[0].getF())\", 1234567890123456u, lists.getList64()[0].getF()"
                 ,(char (*) [70])
                  "failed: expected (1234567890123456u) == (lists.getList64()[0].getF())",&local_bf0
                 ,&local_bf8);
      local_be1 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getList64((Reader *)local_cb8,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Reader::operator[]
            (&local_c88,(Reader *)local_cb8,1);
  uVar7 = capnproto_test::capnp::test::TestLists::Struct64::Reader::getF(&local_c88);
  if (uVar7 != 0x85561edaa4b87) {
    local_cb9 = kj::_::Debug::shouldLog(ERROR);
    while (local_cb9 != false) {
      local_cc8 = 0x85561edaa4b87;
      capnproto_test::capnp::test::TestLists::Reader::getList64(&local_d30,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Reader::operator[]
                (&local_d00,&local_d30,1);
      local_cd0 = capnproto_test::capnp::test::TestLists::Struct64::Reader::getF(&local_d00);
      kj::_::Debug::log<char_const(&)[70],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2dc,ERROR,
                 "\"failed: expected \" \"(2345678901234567u) == (lists.getList64()[1].getF())\", 2345678901234567u, lists.getList64()[1].getF()"
                 ,(char (*) [70])
                  "failed: expected (2345678901234567u) == (lists.getList64()[1].getF())",&local_cc8
                 ,&local_cd0);
      local_cb9 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getListP((Reader *)local_da0,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Reader::operator[]
            (&local_d70,(Reader *)local_da0,0);
  local_d40 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestLists::StructP::Reader::getF(&local_d70);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_d40);
  if (!bVar1) {
    local_da1 = kj::_::Debug::shouldLog(ERROR);
    while (local_da1 != false) {
      capnproto_test::capnp::test::TestLists::Reader::getListP(&local_e18,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Reader::operator[]
                (&local_de8,&local_e18,0);
      local_db8 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestLists::StructP::Reader::getF(&local_de8);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2dd,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (lists.getListP()[0].getF())\", \"foo\", lists.getListP()[0].getF()"
                 ,(char (*) [57])"failed: expected (\"foo\") == (lists.getListP()[0].getF())",
                 (char (*) [4])"foo",(Reader *)&local_db8);
      local_da1 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getListP((Reader *)local_e88,(Reader *)local_38);
  List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Reader::operator[]
            (&local_e58,(Reader *)local_e88,1);
  local_e28 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestLists::StructP::Reader::getF(&local_e58);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_e28);
  if (!bVar1) {
    local_e89 = kj::_::Debug::shouldLog(ERROR);
    while (local_e89 != false) {
      capnproto_test::capnp::test::TestLists::Reader::getListP
                ((Reader *)&l.reader.nestingLimit,(Reader *)local_38);
      List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Reader::operator[]
                (&local_ed0,(Reader *)&l.reader.nestingLimit,1);
      local_ea0 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestLists::StructP::Reader::getF(&local_ed0);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2de,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (lists.getListP()[1].getF())\", \"bar\", lists.getListP()[1].getF()"
                 ,(char (*) [57])"failed: expected (\"bar\") == (lists.getListP()[1].getF())",
                 (char (*) [4])0x4b5bf5,(Reader *)&local_ea0);
      local_e89 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Reader::getInt32ListList
            ((Reader *)&f_7,(Reader *)local_38);
  uVar4 = List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Reader::size((Reader *)&f_7);
  if (uVar4 != 3) {
    local_f3c = 3;
    local_f40 = List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Reader::size((Reader *)&f_7)
    ;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_f38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2e2,FAILED,"(3u) == (l.size())","3u, l.size()",&local_f3c,&local_f40);
    kj::_::Debug::Fault::fatal(&local_f38);
  }
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Reader::operator[]
            (&local_f70,(Reader *)&f_7,0);
  local_f8c[0] = 1;
  local_f8c[1] = 2;
  local_f8c[2] = 3;
  local_f80 = local_f8c;
  local_f78 = 3;
  expected_04._M_len = 3;
  expected_04._M_array = local_f80;
  reader_00.reader.capTable = local_f70.reader.capTable;
  reader_00.reader.segment = local_f70.reader.segment;
  reader_00.reader.ptr = local_f70.reader.ptr;
  reader_00.reader.elementCount = local_f70.reader.elementCount;
  reader_00.reader.step = local_f70.reader.step;
  reader_00.reader.structDataSize = local_f70.reader.structDataSize;
  reader_00.reader.structPointerCount = local_f70.reader.structPointerCount;
  reader_00.reader.elementSize = local_f70.reader.elementSize;
  reader_00.reader._39_1_ = local_f70.reader._39_1_;
  reader_00.reader.nestingLimit = local_f70.reader.nestingLimit;
  reader_00.reader._44_4_ = local_f70.reader._44_4_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_00,expected_04);
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Reader::operator[]
            (&local_fc0,(Reader *)&f_7,1);
  local_fd8[0] = 4;
  local_fd8[1] = 5;
  local_fd0 = local_fd8;
  local_fc8 = 2;
  expected_03._M_len = 2;
  expected_03._M_array = local_fd0;
  reader_01.reader.capTable = local_fc0.reader.capTable;
  reader_01.reader.segment = local_fc0.reader.segment;
  reader_01.reader.ptr = local_fc0.reader.ptr;
  reader_01.reader.elementCount = local_fc0.reader.elementCount;
  reader_01.reader.step = local_fc0.reader.step;
  reader_01.reader.structDataSize = local_fc0.reader.structDataSize;
  reader_01.reader.structPointerCount = local_fc0.reader.structPointerCount;
  reader_01.reader.elementSize = local_fc0.reader.elementSize;
  reader_01.reader._39_1_ = local_fc0.reader._39_1_;
  reader_01.reader.nestingLimit = local_fc0.reader.nestingLimit;
  reader_01.reader._44_4_ = local_fc0.reader._44_4_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_01,expected_03);
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Reader::operator[]
            (&local_1008,(Reader *)&f_7,2);
  l_1.reader._44_4_ = 0xbc4ff2;
  expected_02._M_len = 1;
  expected_02._M_array = (iterator)&l_1.reader.field_0x2c;
  reader_02.reader.capTable = local_1008.reader.capTable;
  reader_02.reader.segment = local_1008.reader.segment;
  reader_02.reader.ptr = local_1008.reader.ptr;
  reader_02.reader.elementCount = local_1008.reader.elementCount;
  reader_02.reader.step = local_1008.reader.step;
  reader_02.reader.structDataSize = local_1008.reader.structDataSize;
  reader_02.reader.structPointerCount = local_1008.reader.structPointerCount;
  reader_02.reader.elementSize = local_1008.reader.elementSize;
  reader_02.reader._39_1_ = local_1008.reader._39_1_;
  reader_02.reader.nestingLimit = local_1008.reader.nestingLimit;
  reader_02.reader._44_4_ = local_1008.reader._44_4_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_02,expected_02);
  capnproto_test::capnp::test::TestLists::Reader::getTextListList((Reader *)&f_8,(Reader *)local_38)
  ;
  uVar4 = List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Reader::size
                    ((Reader *)&f_8);
  if (uVar4 != 3) {
    local_105c = 3;
    local_1060 = List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Reader::size
                           ((Reader *)&f_8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_1058,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2ea,FAILED,"(3u) == (l.size())","3u, l.size()",&local_105c,&local_1060);
    kj::_::Debug::Fault::fatal(&local_1058);
  }
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Reader::operator[]
            (&local_1090,(Reader *)&f_8,0);
  Text::Reader::Reader(&local_10c0,"foo");
  Text::Reader::Reader(&RStack_10b0,"bar");
  local_10a0 = &local_10c0;
  local_1098 = 2;
  expected_01._M_len = 2;
  expected_01._M_array = local_10a0;
  reader_03.reader.capTable = local_1090.reader.capTable;
  reader_03.reader.segment = local_1090.reader.segment;
  reader_03.reader.ptr = local_1090.reader.ptr;
  reader_03.reader.elementCount = local_1090.reader.elementCount;
  reader_03.reader.step = local_1090.reader.step;
  reader_03.reader.structDataSize = local_1090.reader.structDataSize;
  reader_03.reader.structPointerCount = local_1090.reader.structPointerCount;
  reader_03.reader.elementSize = local_1090.reader.elementSize;
  reader_03.reader._39_1_ = local_1090.reader._39_1_;
  reader_03.reader.nestingLimit = local_1090.reader.nestingLimit;
  reader_03.reader._44_4_ = local_1090.reader._44_4_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_03,expected_01);
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Reader::operator[]
            (&local_10f0,(Reader *)&f_8,1);
  Text::Reader::Reader(&local_1110,"baz");
  local_1100 = &local_1110;
  local_10f8 = 1;
  expected_00._M_len = 1;
  expected_00._M_array = local_1100;
  reader_04.reader.capTable = local_10f0.reader.capTable;
  reader_04.reader.segment = local_10f0.reader.segment;
  reader_04.reader.ptr = local_10f0.reader.ptr;
  reader_04.reader.elementCount = local_10f0.reader.elementCount;
  reader_04.reader.step = local_10f0.reader.step;
  reader_04.reader.structDataSize = local_10f0.reader.structDataSize;
  reader_04.reader.structPointerCount = local_10f0.reader.structPointerCount;
  reader_04.reader.elementSize = local_10f0.reader.elementSize;
  reader_04.reader._39_1_ = local_10f0.reader._39_1_;
  reader_04.reader.nestingLimit = local_10f0.reader.nestingLimit;
  reader_04.reader._44_4_ = local_10f0.reader._44_4_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_04,expected_00);
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Reader::operator[]
            (&local_1140,(Reader *)&f_8,2);
  Text::Reader::Reader((Reader *)&l_2.reader.nestingLimit,"qux");
  Text::Reader::Reader(&RStack_1160,"corge");
  local_1150 = &l_2.reader.nestingLimit;
  local_1148 = 2;
  expected._M_len = 2;
  expected._M_array = (iterator)local_1150;
  reader_05.reader.capTable = local_1140.reader.capTable;
  reader_05.reader.segment = local_1140.reader.segment;
  reader_05.reader.ptr = local_1140.reader.ptr;
  reader_05.reader.elementCount = local_1140.reader.elementCount;
  reader_05.reader.step = local_1140.reader.step;
  reader_05.reader.structDataSize = local_1140.reader.structDataSize;
  reader_05.reader.structPointerCount = local_1140.reader.structPointerCount;
  reader_05.reader.elementSize = local_1140.reader.elementSize;
  reader_05.reader._39_1_ = local_1140.reader._39_1_;
  reader_05.reader.nestingLimit = local_1140.reader.nestingLimit;
  reader_05.reader._44_4_ = local_1140.reader._44_4_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_05,expected);
  capnproto_test::capnp::test::TestLists::Reader::getStructListList
            ((Reader *)&f_9,(Reader *)local_38);
  uVar4 = List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
          ::Reader::size((Reader *)&f_9);
  if (uVar4 != 2) {
    e.reader._44_4_ = 2;
    e.reader.nestingLimit =
         List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
         ::Reader::size((Reader *)&f_9);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_11a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2f2,FAILED,"(2u) == (l.size())","2u, l.size()",(uint *)&e.reader.field_0x2c,
               (uint *)&e.reader.nestingLimit);
    kj::_::Debug::Fault::fatal(&local_11a8);
  }
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Reader::operator[]((Reader *)&f_10,(Reader *)&f_9,0);
  uVar4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_10);
  if (uVar4 != 2) {
    local_11ec = 2;
    local_11f0 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                           ((Reader *)&f_10);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_11e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2f4,FAILED,"(2u) == (e.size())","2u, e.size()",&local_11ec,&local_11f0);
    kj::_::Debug::Fault::fatal(&local_11e8);
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_1220,(Reader *)&f_10,0);
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field((Reader *)local_1220);
  if (iVar6 != 0x7b) {
    local_1221 = kj::_::Debug::shouldLog(ERROR);
    while (local_1221 != false) {
      local_1228 = 0x7b;
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_1260,(Reader *)&f_10,0);
      local_122c = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_1260);
      kj::_::Debug::log<char_const(&)[49],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2f5,ERROR,
                 "\"failed: expected \" \"(123) == (e[0].getInt32Field())\", 123, e[0].getInt32Field()"
                 ,(char (*) [49])"failed: expected (123) == (e[0].getInt32Field())",&local_1228,
                 &local_122c);
      local_1221 = false;
    }
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_1290,(Reader *)&f_10,1);
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field((Reader *)local_1290);
  if (iVar6 != 0x1c8) {
    local_1291 = kj::_::Debug::shouldLog(ERROR);
    while (local_1291 != false) {
      local_1298 = 0x1c8;
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_12d0,(Reader *)&f_10,1);
      local_129c = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_12d0);
      kj::_::Debug::log<char_const(&)[49],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2f6,ERROR,
                 "\"failed: expected \" \"(456) == (e[1].getInt32Field())\", 456, e[1].getInt32Field()"
                 ,(char (*) [49])"failed: expected (456) == (e[1].getInt32Field())",&local_1298,
                 &local_129c);
      local_1291 = false;
    }
  }
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Reader::operator[]((Reader *)&f_11,(Reader *)&f_9,1);
  memcpy(&f_10,&f_11,0x30);
  uVar4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f_10);
  if (uVar4 != 1) {
    local_130c = 1;
    local_1310 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                           ((Reader *)&f_10);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_1308,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x2f8,FAILED,"(1u) == (e.size())","1u, e.size()",&local_130c,&local_1310);
    kj::_::Debug::Fault::fatal(&local_1308);
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_1340,(Reader *)&f_10,0);
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field((Reader *)local_1340);
  if (iVar6 != 0x315) {
    local_1341 = kj::_::Debug::shouldLog(ERROR);
    while (local_1341 != false) {
      local_1348 = 0x315;
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_1380,(Reader *)&f_10,0);
      local_134c = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_1380);
      kj::_::Debug::log<char_const(&)[49],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x2f9,ERROR,
                 "\"failed: expected \" \"(789) == (e[0].getInt32Field())\", 789, e[0].getInt32Field()"
                 ,(char (*) [49])"failed: expected (789) == (e[0].getInt32Field())",&local_1348,
                 &local_134c);
      local_1341 = false;
    }
  }
  return;
}

Assistant:

void genericCheckListDefaults(Reader reader) {
  auto lists = reader.getLists();

  ASSERT_EQ(2u, lists.getList0().size());
  ASSERT_EQ(4u, lists.getList1().size());
  ASSERT_EQ(2u, lists.getList8().size());
  ASSERT_EQ(2u, lists.getList16().size());
  ASSERT_EQ(2u, lists.getList32().size());
  ASSERT_EQ(2u, lists.getList64().size());
  ASSERT_EQ(2u, lists.getListP().size());

  EXPECT_EQ(VOID, lists.getList0()[0].getF());
  EXPECT_EQ(VOID, lists.getList0()[1].getF());
  EXPECT_TRUE(lists.getList1()[0].getF());
  EXPECT_FALSE(lists.getList1()[1].getF());
  EXPECT_TRUE(lists.getList1()[2].getF());
  EXPECT_TRUE(lists.getList1()[3].getF());
  EXPECT_EQ(123u, lists.getList8()[0].getF());
  EXPECT_EQ(45u, lists.getList8()[1].getF());
  EXPECT_EQ(12345u, lists.getList16()[0].getF());
  EXPECT_EQ(6789u, lists.getList16()[1].getF());
  EXPECT_EQ(123456789u, lists.getList32()[0].getF());
  EXPECT_EQ(234567890u, lists.getList32()[1].getF());
  EXPECT_EQ(1234567890123456u, lists.getList64()[0].getF());
  EXPECT_EQ(2345678901234567u, lists.getList64()[1].getF());
  EXPECT_EQ("foo", lists.getListP()[0].getF());
  EXPECT_EQ("bar", lists.getListP()[1].getF());

  {
    auto l = lists.getInt32ListList();
    ASSERT_EQ(3u, l.size());
    checkList(l[0], {1, 2, 3});
    checkList(l[1], {4, 5});
    checkList(l[2], {12341234});
  }

  {
    auto l = lists.getTextListList();
    ASSERT_EQ(3u, l.size());
    checkList(l[0], {"foo", "bar"});
    checkList(l[1], {"baz"});
    checkList(l[2], {"qux", "corge"});
  }

  {
    auto l = lists.getStructListList();
    ASSERT_EQ(2u, l.size());
    auto e = l[0];
    ASSERT_EQ(2u, e.size());
    EXPECT_EQ(123, e[0].getInt32Field());
    EXPECT_EQ(456, e[1].getInt32Field());
    e = l[1];
    ASSERT_EQ(1u, e.size());
    EXPECT_EQ(789, e[0].getInt32Field());
  }
}